

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O3

void __thiscall double_conversion::Bignum::MultiplyByUInt32(Bignum *this,uint32_t factor)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  if (factor != 1) {
    if (factor == 0) {
      this->used_bigits_ = 0;
      this->exponent_ = 0;
      return;
    }
    lVar2 = (long)this->used_bigits_;
    if (0 < lVar2) {
      lVar4 = 0;
      uVar3 = 0;
      do {
        uVar5 = (ulong)this->bigits_buffer_[lVar4] * (ulong)factor + uVar3;
        this->bigits_buffer_[lVar4] = (uint)uVar5 & 0xfffffff;
        uVar3 = uVar5 >> 0x1c;
        lVar4 = lVar4 + 1;
      } while (lVar2 != lVar4);
      while (uVar1 = uVar3, 0xfffffff < uVar5) {
        if (0x7f < (short)lVar2) {
          abort();
        }
        this->bigits_buffer_[lVar2] = (uint)uVar1 & 0xfffffff;
        lVar2 = lVar2 + 1;
        this->used_bigits_ = (int16_t)lVar2;
        uVar3 = uVar1 >> 0x1c;
        uVar5 = uVar1;
      }
    }
  }
  return;
}

Assistant:

void Bignum::MultiplyByUInt32(const uint32_t factor) {
  if (factor == 1) {
    return;
  }
  if (factor == 0) {
    Zero();
    return;
  }
  if (used_bigits_ == 0) {
    return;
  }
  // The product of a bigit with the factor is of size kBigitSize + 32.
  // Assert that this number + 1 (for the carry) fits into double chunk.
  DOUBLE_CONVERSION_ASSERT(kDoubleChunkSize >= kBigitSize + 32 + 1);
  DoubleChunk carry = 0;
  for (int i = 0; i < used_bigits_; ++i) {
    const DoubleChunk product = static_cast<DoubleChunk>(factor) * RawBigit(i) + carry;
    RawBigit(i) = static_cast<Chunk>(product & kBigitMask);
    carry = (product >> kBigitSize);
  }
  while (carry != 0) {
    EnsureCapacity(used_bigits_ + 1);
    RawBigit(used_bigits_) = carry & kBigitMask;
    used_bigits_++;
    carry >>= kBigitSize;
  }
}